

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O2

ssize_t __thiscall
bitio::bitio_stream::read(bitio_stream *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  byte bVar2;
  sbyte sVar3;
  byte bVar4;
  uint uVar5;
  char cVar6;
  ulong uVar7;
  bool bVar8;
  
  if (__fd != 0) {
    bVar1 = (byte)__fd;
    bVar2 = this->bit_count;
    if (bVar2 == 0) {
      load_byte(this);
      bVar2 = 8;
    }
    bVar4 = bVar2 - bVar1;
    if (bVar2 < bVar1) {
      uVar7 = (ulong)(this->bit_buffer >> (8 - bVar2 & 0x1f));
      cVar6 = (char)(bVar1 - bVar2) >> 3;
      this->bit_buffer = '\0';
      this->bit_count = '\0';
      while (bVar8 = cVar6 != '\0', cVar6 = cVar6 + -1, bVar8) {
        load_byte(this);
        uVar7 = uVar7 << 8 | (ulong)this->bit_buffer;
      }
      load_byte(this);
      uVar5 = (byte)(bVar1 - bVar2) & 7;
      sVar3 = (sbyte)uVar5;
      bVar4 = 8 - sVar3;
      uVar7 = (ulong)(byte)((reverse_bit_masks[uVar5] & this->bit_buffer) >> (bVar4 & 0x1f)) +
              (uVar7 << sVar3);
      this->bit_buffer = this->bit_buffer << sVar3;
    }
    else {
      uVar7 = (ulong)(byte)((reverse_bit_masks[(ulong)(uint)__fd & 0xff] & this->bit_buffer) >>
                           (8 - bVar1 & 0x1f));
      this->bit_buffer = this->bit_buffer << (bVar1 & 0x1f);
    }
    this->bit_count = bVar4;
    return uVar7 & *(ulong *)(ui64_masks + ((ulong)(uint)__fd & 0xff) * 8);
  }
  return 0;
}

Assistant:

uint64_t bitio_stream::read(uint8_t n) {
    if (n == 0) {
        return 0;
    }

    uint64_t value = 0;
    if (bit_count == 0) {
        load_byte();
        bit_count = 8;
    }

    if (bit_count >= n) {
        value += (bit_buffer & reverse_bit_masks[n]) >> (8 - n);
        bit_buffer <<= n;
        bit_count -= n;
    } else {
        value += bit_buffer >> (8 - bit_count);
        char target_bits = n - bit_count;
        char nbytes = target_bits >> 3;
        bit_buffer = 0;
        bit_count = 0;

        while (nbytes--) {
            load_byte();
            value <<= 8;
            value += bit_buffer;
        }
        load_byte();
        bit_count = 8;

        char rembits = target_bits & bit_masks[3];

        value <<= rembits;
        value += (bit_buffer & reverse_bit_masks[rembits]) >> (8 - rembits);
        bit_buffer <<= rembits;
        bit_count -= rembits;
    }
    return value & ui64_masks[n];
}